

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

void matchit::impl::IdUtil<std::shared_ptr<mathiu::impl::Expr_const>>::
     bindValue<std::shared_ptr<mathiu::impl::Expr_const>const&>
               (_Move_assign_base<false,_std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                *v,_Variadic_union<std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                   value)

{
  _Variadic_union<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
  local_20;
  undefined1 local_10;
  
  local_10 = 3;
  local_20._M_rest._M_rest = value;
  std::__detail::__variant::
  _Move_assign_base<false,_std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
  ::operator=(v,(_Move_assign_base<false,_std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                 *)&local_20);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                       *)&local_20);
  return;
}

Assistant:

constexpr static auto bindValue(ValueVariant<Type> &v, Value &&value,
                                                    std::true_type /* StorePointer */)
            {
                v = ValueVariant<Type>{&value};
            }